

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolBuilders.cpp
# Opt level: O2

MethodBuilder * __thiscall
slang::ast::ClassBuilder::addMethod
          (MethodBuilder *__return_storage_ptr__,ClassBuilder *this,string_view name,Type *retType,
          SubroutineKind kind)

{
  MethodBuilder::MethodBuilder(__return_storage_ptr__,this->compilation,name,retType,kind);
  Scope::addMember(&this->type->super_Scope,&__return_storage_ptr__->symbol->super_Symbol);
  return __return_storage_ptr__;
}

Assistant:

MethodBuilder ClassBuilder::addMethod(std::string_view name, const Type& retType,
                                      SubroutineKind kind) {
    MethodBuilder method(compilation, name, retType, kind);
    type.addMember(method.symbol);
    return method;
}